

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O2

bool __thiscall Rml::FontEffectOutline::Initialise(FontEffectOutline *this,int _width)

{
  float *pfVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  if (0 < _width) {
    this->width = _width;
    ConvolutionFilter::Initialise(&this->filter,_width,Dilation);
    uVar2 = (ulong)(uint)this->width;
    for (iVar3 = -this->width; iVar3 <= (int)uVar2; iVar3 = iVar3 + 1) {
      for (lVar5 = (long)-(int)uVar2; iVar4 = (int)lVar5, iVar4 <= (int)uVar2; lVar5 = lVar5 + 1) {
        fVar6 = Math::SquareRoot((float)(iVar4 * iVar4 + iVar3 * iVar3));
        iVar4 = this->width;
        fVar7 = 1.0;
        if (((float)iVar4 < fVar6) && (fVar7 = (float)(iVar4 + 1) - fVar6, fVar7 <= 0.0)) {
          fVar7 = 0.0;
        }
        pfVar1 = ConvolutionFilter::operator[](&this->filter,iVar4 + iVar3);
        uVar2 = (ulong)this->width;
        pfVar1[uVar2 + lVar5] = fVar7;
      }
    }
  }
  return 0 < _width;
}

Assistant:

bool FontEffectOutline::Initialise(int _width)
{
	if (_width <= 0)
		return false;

	width = _width;

	filter.Initialise(width, FilterOperation::Dilation);
	for (int x = -width; x <= width; ++x)
	{
		for (int y = -width; y <= width; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width)
			{
				weight = (width + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter[x + width][y + width] = weight;
		}
	}

	return true;
}